

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O3

QAction * __thiscall QLineEdit::addAction(QLineEdit *this,QIcon *icon,ActionPosition position)

{
  QLineEditPrivate *this_00;
  QAction *this_01;
  long in_FS_OFFSET;
  QArrayData *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (QAction *)operator_new(0x10);
  local_48 = (QArrayData *)0x0;
  uStack_40 = 0;
  local_38 = 0;
  QAction::QAction(this_01,icon,(QString *)&local_48,(QObject *)this);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,0x10);
    }
  }
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  QWidget::addAction(&this->super_QWidget,this_01);
  QLineEditPrivate::addAction(this_00,this_01,(QAction *)0x0,position,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this_01;
  }
  __stack_chk_fail();
}

Assistant:

QAction *QLineEdit::addAction(const QIcon &icon, ActionPosition position)
{
    QAction *result = new QAction(icon, QString(), this);
    addAction(result, position);
    return result;
}